

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_estimateCDictSize(size_t dictSize,int compressionLevel)

{
  ulong uVar1;
  ZSTD_compressionParameters cParams;
  ZSTD_compressionParameters local_30;
  
  ZSTD_getCParams_internal
            (&local_30,compressionLevel,0xffffffffffffffff,dictSize,ZSTD_cpm_createCDict);
  uVar1 = (2L << ((byte)local_30.hashLog & 0x3f)) + 0x3fU & 0xffffffffffffffc0;
  if (local_30.windowLog < 0xf) {
    uVar1 = 0;
  }
  if (local_30.strategy - ZSTD_btlazy2 < 0xfffffffd) {
    uVar1 = 0;
  }
  return uVar1 + (dictSize + 7 & 0xfffffffffffffff8) + (4L << ((byte)local_30.chainLog & 0x3f)) +
                 (4L << ((byte)local_30.hashLog & 0x3f)) + 0x2cd0;
}

Assistant:

size_t ZSTD_estimateCDictSize(size_t dictSize, int compressionLevel)
{
    ZSTD_compressionParameters const cParams = ZSTD_getCParams_internal(compressionLevel, ZSTD_CONTENTSIZE_UNKNOWN, dictSize, ZSTD_cpm_createCDict);
    return ZSTD_estimateCDictSize_advanced(dictSize, cParams, ZSTD_dlm_byCopy);
}